

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

ByteArray *
ByteArray::fromFile(ByteArray *__return_storage_ptr__,path *fileName,long start,size_t size)

{
  char cVar1;
  uintmax_t uVar2;
  size_t sVar3;
  size_t neededSize;
  ifstream stream;
  
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            (&stream,fileName,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    uVar2 = ghc::filesystem::file_size(fileName);
    sVar3 = uVar2 - start;
    if ((ulong)start <= uVar2 && sVar3 != 0) {
      std::istream::seekg(&stream,start,0);
      neededSize = size;
      if (uVar2 < start + size) {
        neededSize = sVar3;
      }
      if (size == 0) {
        neededSize = sVar3;
      }
      __return_storage_ptr__->data_ = (byte *)0x0;
      __return_storage_ptr__->size_ = 0;
      __return_storage_ptr__->allocatedSize_ = 0;
      grow(__return_storage_ptr__,neededSize);
      std::istream::read((char *)&stream,(long)__return_storage_ptr__->data_);
      __return_storage_ptr__->size_ =
           stream.super_basic_ifstream<char,_std::char_traits<char>_>.
           super_basic_istream<char,_std::char_traits<char>_>._M_gcount;
      goto LAB_00146d42;
    }
  }
  __return_storage_ptr__->data_ = (byte *)0x0;
  __return_storage_ptr__->size_ = 0;
  __return_storage_ptr__->allocatedSize_ = 0;
LAB_00146d42:
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&stream);
  return __return_storage_ptr__;
}

Assistant:

ByteArray ByteArray::fromFile(const fs::path& fileName, long start, size_t size)
{
	fs::ifstream stream(fileName, fs::fstream::in | fs::fstream::binary);
	if (!stream.is_open())
		return {};

	auto fileSize = fs::file_size(fileName);
	if (start >= fileSize)
		return {};

	if (size == 0 || start+(long)size > fileSize)
		size = fileSize-start;

	stream.seekg(start);

	ByteArray ret;
	ret.grow(size);

	stream.read(reinterpret_cast<char *>(ret.data()), size);
	ret.size_ = stream.gcount();

	return ret;
}